

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Tokenizer.cpp
# Opt level: O0

Token * __thiscall Tokenizer::peekToken(Tokenizer *this,int ahead)

{
  bool bVar1;
  int local_2c;
  iterator iStack_28;
  int i;
  iterator it;
  int ahead_local;
  Tokenizer *this_local;
  
  iStack_28._M_node = (this->position).it._M_node;
  local_2c = 0;
  it._M_node._4_4_ = ahead;
  while( true ) {
    if (it._M_node._4_4_ <= local_2c) {
      bVar1 = processElement(this,&stack0xffffffffffffffd8);
      if (bVar1) {
        this_local = (Tokenizer *)std::_List_iterator<Token>::operator*(&stack0xffffffffffffffd8);
      }
      else {
        this_local = (Tokenizer *)&this->invalidToken;
      }
      return (Token *)this_local;
    }
    bVar1 = processElement(this,&stack0xffffffffffffffd8);
    if (!bVar1) break;
    std::_List_iterator<Token>::operator++(&stack0xffffffffffffffd8);
    local_2c = local_2c + 1;
  }
  return &this->invalidToken;
}

Assistant:

const Token& Tokenizer::peekToken(int ahead)
{
	auto it = position.it;
	for (int i = 0; i < ahead; i++)
	{
		if (!processElement(it))
			return invalidToken;

		++it;
	}
	
	if (!processElement(it))
		return invalidToken;

	return *it;
}